

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runxmlconf.c
# Opt level: O1

int xmlconfTestCases(xmlDocPtr doc,xmlNodePtr cur,int level)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  char *__s2;
  char *__file;
  long lVar7;
  long lVar8;
  long lVar9;
  int *piVar10;
  uint uVar11;
  char **ppcVar12;
  stat64 *psVar13;
  char *msg;
  char *pcVar14;
  int level_00;
  uint uVar15;
  int iVar16;
  _xmlNode *cur_00;
  char buf [500];
  long local_280;
  long local_270;
  long local_268;
  long local_248;
  stat64 *local_240;
  stat64 local_228 [3];
  
  level_00 = 2;
  iVar16 = 0;
  if (level == 1) {
    lVar6 = xmlGetProp(cur,"PROFILE");
    if (lVar6 != 0) {
      printf("Test cases: %s\n",lVar6);
      (*_xmlFree)(lVar6);
      bVar2 = 1;
      goto LAB_00102922;
    }
    level_00 = 1;
  }
  bVar2 = 0;
LAB_00102922:
  cur_00 = cur->children;
  uVar11 = 0;
  if (cur_00 != (_xmlNode *)0x0) {
    uVar11 = 0;
    iVar16 = 0;
    do {
      if (cur_00->type == XML_ELEMENT_NODE) {
        iVar4 = xmlStrEqual(cur_00->name,"TESTCASES");
        if (iVar4 == 0) {
          iVar4 = xmlStrEqual(cur_00->name,"TEST");
          if (iVar4 == 0) {
            xmlconfTestCases_cold_1();
          }
          else {
            testErrorsSize = 0;
            testErrors[0] = '\0';
            nbError = 0;
            nbFatal = 0;
            __s2 = (char *)xmlGetProp(cur_00,"ID");
            if (__s2 == (char *)0x0) {
              pcVar14 = (char *)xmlGetLineNo(cur_00);
              msg = "test missing ID, line %ld\n";
LAB_00102c46:
              __file = (char *)0x0;
              test_log(msg,pcVar14);
              local_240 = (stat64 *)0x0;
              local_248 = 0;
              local_280 = 0;
              local_268 = 0;
              lVar7 = 0;
              local_270 = 0;
              lVar6 = 0;
              uVar15 = 0;
            }
            else {
              if (skipped_tests[0] != (char *)0x0) {
                ppcVar12 = skipped_tests;
                pcVar14 = skipped_tests[0];
                do {
                  ppcVar12 = ppcVar12 + 1;
                  iVar4 = strcmp(pcVar14,__s2);
                  if (iVar4 == 0) {
                    test_log("Skipping test %s from skipped list\n",__s2);
                    nb_skipped = nb_skipped + 1;
                    uVar15 = 1;
                    __file = (char *)0x0;
                    local_240 = (stat64 *)0x0;
                    local_248 = 0;
                    local_280 = 0;
                    local_268 = 0;
                    lVar7 = 0;
                    local_270 = 0;
                    lVar6 = 0;
                    goto LAB_00102ffa;
                  }
                  pcVar14 = *ppcVar12;
                } while (pcVar14 != (char *)0x0);
              }
              lVar6 = xmlGetProp(cur_00,"TYPE");
              if (lVar6 == 0) {
                msg = "test %s missing TYPE\n";
                pcVar14 = __s2;
                goto LAB_00102c46;
              }
              local_240 = (stat64 *)xmlGetProp(cur_00,"URI");
              if (local_240 == (stat64 *)0x0) {
                __file = (char *)0x0;
                test_log("test %s missing URI\n",__s2);
                local_240 = (stat64 *)0x0;
                local_248 = 0;
LAB_00102ce1:
                local_280 = 0;
                local_268 = 0;
                lVar7 = 0;
                local_270 = 0;
                uVar15 = 0;
              }
              else {
                local_248 = xmlNodeGetBase(doc,cur_00);
                psVar13 = local_240;
                if (local_248 != 0) {
                  snprintf((char *)local_228,500,"%s/%s",local_248,local_240);
                  psVar13 = local_228;
                }
                __file = (char *)xmlStrdup(psVar13);
                iVar4 = stat64(__file,local_228);
                if ((iVar4 == -1) || ((local_228[0].st_mode & 0xf000) != 0x8000)) {
                  pcVar14 = __file;
                  if (__file == (char *)0x0) {
                    pcVar14 = "NULL";
                  }
                  test_log("test %s missing file %s \n",__s2,pcVar14);
                  goto LAB_00102ce1;
                }
                local_268 = xmlGetProp(cur_00,"VERSION");
                lVar7 = xmlGetProp(cur_00,"ENTITIES");
                iVar4 = xmlStrEqual(lVar7,"none");
                uVar15 = 0;
                if (iVar4 == 0) {
                  uVar15 = 6;
                }
                local_280 = xmlGetProp(cur_00,"RECOMMENDATION");
                if ((((local_280 == 0) || (iVar4 = xmlStrEqual(local_280,"XML1.0"), iVar4 != 0)) ||
                    (iVar4 = xmlStrEqual(local_280,"XML1.0-errata2e"), iVar4 != 0)) ||
                   ((iVar4 = xmlStrEqual(local_280,"XML1.0-errata3e"), iVar4 != 0 ||
                    (iVar4 = xmlStrEqual(local_280,"XML1.0-errata4e"), iVar4 != 0)))) {
                  bVar1 = true;
                  if ((local_268 != 0) && (iVar4 = xmlStrEqual(local_268,"1.0"), iVar4 == 0)) {
                    pcVar14 = "Skipping test %s for %s\n";
                    lVar8 = local_268;
                    goto LAB_00102e51;
                  }
LAB_00102b8d:
                  local_270 = xmlGetProp(cur_00,"EDITION");
                  uVar3 = uVar15;
                  if (local_270 != 0) {
                    lVar8 = xmlStrchr(local_270,0x35);
                    uVar3 = uVar15 + 0x20000;
                    if (lVar8 != 0) {
                      uVar3 = uVar15;
                    }
                  }
                  xmlResetLastError();
                  testErrorsSize = 0;
                  testErrors[0] = '\0';
                  iVar4 = xmlMemUsed();
                  iVar5 = xmlStrEqual(lVar6,"not-wf");
                  if (iVar5 != 0) {
                    lVar8 = xmlReadFile(__file,0,uVar3);
                    if (bVar1) {
                      if (lVar8 != 0) {
                        pcVar14 = "test %s : %s failed to detect not well formedness\n";
LAB_00102e28:
                        test_log(pcVar14,__s2,__file);
                        nb_errors = nb_errors + 1;
LAB_00102e35:
                        xmlFreeDoc(lVar8);
                      }
                    }
                    else {
                      if (lVar8 != 0) {
                        lVar9 = __xmlLastError();
                        if ((*(int *)(lVar9 + 4) == 0) ||
                           (piVar10 = (int *)__xmlLastError(), *piVar10 != 3)) {
                          pcVar14 = "test %s : %s failed to detect namespace error\n";
                          goto LAB_00102e28;
                        }
                        goto LAB_00102e35;
                      }
                      test_log("test %s : %s failed to parse the XML\n",__s2,__file);
                      nb_errors = nb_errors + 1;
                    }
LAB_00102fa6:
                    xmlResetLastError();
                    iVar5 = xmlMemUsed();
                    uVar15 = iVar5 - iVar4;
                    if (uVar15 != 0 && iVar4 <= iVar5) {
                      test_log("test %s : %s leaked %d bytes\n",__s2,__file,(ulong)uVar15);
                      nb_leaks = nb_leaks + 1;
                      xmlMemDisplayLast(logfile,(long)(int)uVar15);
                    }
                    nb_tests = nb_tests + 1;
                    goto LAB_00102ff0;
                  }
                  iVar5 = xmlStrEqual(lVar6,"valid");
                  if (iVar5 != 0) {
                    lVar8 = xmlNewParserCtxt();
                    if (lVar8 == 0) {
LAB_00102efc:
                      test_log("test %s : %s out of memory\n",__s2,__file);
                      goto LAB_00102fa6;
                    }
                    lVar9 = xmlCtxtReadFile(lVar8,__file,0,uVar3 | 0x10);
                    if (lVar9 == 0) {
                      test_log("test %s : %s failed to parse a valid document\n",__s2,__file);
                      nb_errors = nb_errors + 1;
                    }
                    else {
                      if ((*(int *)(lVar8 + 0x98) == 0) || ((*(byte *)(lVar9 + 0xac) & 8) == 0)) {
                        pcVar14 = "test %s : %s failed to validate a valid document\n";
LAB_00102ed2:
                        test_log(pcVar14,__s2,__file);
                        nb_errors = nb_errors + 1;
                      }
LAB_00102eef:
                      xmlFreeDoc(lVar9);
                    }
LAB_00102f9e:
                    xmlFreeParserCtxt(lVar8);
                    goto LAB_00102fa6;
                  }
                  iVar5 = xmlStrEqual(lVar6,"invalid");
                  if (iVar5 != 0) {
                    lVar8 = xmlNewParserCtxt();
                    if (lVar8 == 0) goto LAB_00102efc;
                    lVar9 = xmlCtxtReadFile(lVar8,__file,0,uVar3 | 0x10);
                    if (lVar9 != 0) {
                      if ((*(int *)(lVar8 + 0x98) != 0) || ((*(byte *)(lVar9 + 0xac) & 8) != 0)) {
                        pcVar14 = "test %s : %s failed to detect invalid document\n";
                        goto LAB_00102ed2;
                      }
                      goto LAB_00102eef;
                    }
                    test_log("test %s : %s invalid document turned not well-formed too\n",__s2,
                             __file);
                    goto LAB_00102f9e;
                  }
                  iVar4 = xmlStrEqual(lVar6,"error");
                  if (iVar4 == 0) {
                    test_log("test %s unknown TYPE value %s\n",__s2,lVar6);
                  }
                  else {
                    test_log("Skipping error test %s \n",__s2);
                    nb_skipped = nb_skipped + 1;
                  }
                  uVar15 = (uint)(iVar4 != 0);
                }
                else {
                  iVar4 = xmlStrEqual(local_280,"NS1.0");
                  if ((iVar4 != 0) || (iVar4 = xmlStrEqual(local_280,"NS1.0-errata1e"), iVar4 != 0))
                  {
                    bVar1 = false;
                    goto LAB_00102b8d;
                  }
                  pcVar14 = "Skipping test %s for REC %s\n";
                  lVar8 = local_280;
LAB_00102e51:
                  test_log(pcVar14,__s2,lVar8);
                  nb_skipped = nb_skipped + 1;
                  local_270 = 0;
LAB_00102ff0:
                  uVar15 = 1;
                }
              }
            }
LAB_00102ffa:
            if (lVar6 != 0) {
              (*_xmlFree)();
            }
            if (lVar7 != 0) {
              (*_xmlFree)(lVar7);
            }
            if (local_270 != 0) {
              (*_xmlFree)();
            }
            if (local_268 != 0) {
              (*_xmlFree)();
            }
            if (__file != (char *)0x0) {
              (*_xmlFree)(__file);
            }
            if (local_240 != (stat64 *)0x0) {
              (*_xmlFree)();
            }
            if (local_248 != 0) {
              (*_xmlFree)();
            }
            if (__s2 != (char *)0x0) {
              (*_xmlFree)(__s2);
            }
            if (local_280 != 0) {
              (*_xmlFree)();
            }
            iVar16 = iVar16 + uVar15;
            uVar11 = uVar11 + 1;
          }
        }
        else {
          iVar4 = xmlconfTestCases(doc,cur_00,level_00);
          iVar16 = iVar16 + iVar4;
        }
      }
      cur_00 = cur_00->next;
    } while (cur_00 != (_xmlNode *)0x0);
  }
  if ((bool)(bVar2 & 0 < (int)uVar11)) {
    printf("Test cases: %d tests\n",(ulong)uVar11);
  }
  return iVar16;
}

Assistant:

static int
xmlconfTestCases(xmlDocPtr doc, xmlNodePtr cur, int level) {
    xmlChar *profile;
    int ret = 0;
    int tests = 0;
    int output = 0;

    if (level == 1) {
	profile = xmlGetProp(cur, BAD_CAST "PROFILE");
	if (profile != NULL) {
	    output = 1;
	    level++;
	    printf("Test cases: %s\n", (char *) profile);
	    xmlFree(profile);
	}
    }
    cur = cur->children;
    while (cur != NULL) {
        /* look only at elements we ignore everything else */
        if (cur->type == XML_ELEMENT_NODE) {
	    if (xmlStrEqual(cur->name, BAD_CAST "TESTCASES")) {
	        ret += xmlconfTestCases(doc, cur, level);
	    } else if (xmlStrEqual(cur->name, BAD_CAST "TEST")) {
	        if (xmlconfTestItem(doc, cur) >= 0)
		    ret++;
		tests++;
	    } else {
	        fprintf(stderr, "Unhandled element %s\n", (char *)cur->name);
	    }
	}
        cur = cur->next;
    }
    if (output == 1) {
	if (tests > 0)
	    printf("Test cases: %d tests\n", tests);
    }
    return(ret);
}